

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

void __thiscall
HashMap<String,_Variant>::HashMap(HashMap<String,_Variant> *this,HashMap<String,_Variant> *other)

{
  Item *key;
  Iterator *pIVar1;
  
  (this->_end).item = &this->endItem;
  (this->_begin).item = &this->endItem;
  this->_size = 0;
  this->capacity = 500;
  this->data = (Item **)0x0;
  (this->endItem).key.data = &String::emptyData.super_Data;
  (this->endItem).value.data = &Variant::nullData.super_Data;
  (this->endItem).prev = (Item *)0x0;
  (this->endItem).next = (Item *)0x0;
  this->freeItem = (Item *)0x0;
  this->blocks = (ItemBlock *)0x0;
  pIVar1 = &other->_begin;
  while (key = pIVar1->item, key != &other->endItem) {
    append(this,&key->key,&key->value);
    pIVar1 = (Iterator *)&key->next;
  }
  return;
}

Assistant:

HashMap(const HashMap& other) : _end(&endItem), _begin(&endItem), _size(0), capacity(500), data(0), freeItem(0), blocks(0)
  {
    endItem.prev = 0;
    endItem.next = 0;
    for(const Item* i = other._begin.item, * end = &other.endItem; i != end; i = i->next)
      append(i->key, i->value);
  }